

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall Fossilize::StreamArchive::~StreamArchive(StreamArchive *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__StreamArchive_0016ca90;
  free(this->zlib_buffer);
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  lVar3 = 0x238;
  do {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)this->seen_blobs + lVar3 + -0x40));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 8);
  pcVar2 = (this->path)._M_dataplus._M_p;
  paVar1 = &(this->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  DatabaseInterface::~DatabaseInterface(&this->super_DatabaseInterface);
  return;
}

Assistant:

~StreamArchive()
	{
		free(zlib_buffer);
		if (file)
			fclose(file);
	}